

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::set_composite_constant
          (CompilerGLSL *this,ConstantID const_id,TypeID type_id,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers)

{
  SPIRConstantOp *pSVar1;
  mapped_type *this_00;
  SPIRConstant *constant;
  TypedID<(spirv_cross::Types)1> local_2c;
  uint32_t local_28;
  uint32_t local_24;
  
  local_2c.id = type_id.id;
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRConstantOp>(&this->super_Compiler,const_id.id);
  if (pSVar1 == (SPIRConstantOp *)0x0) {
    constant = Compiler::set<spirv_cross::SPIRConstant,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                         (&this->super_Compiler,const_id.id,&local_2c);
    fill_composite_constant(this,constant,(TypeID)local_2c.id,initializers);
    local_28 = const_id.id;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&(this->super_Compiler).forwarded_temporaries,&local_28);
  }
  else {
    local_24 = const_id.id;
    this_00 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->const_composite_insert_ids,&local_24);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=(this_00,initializers);
  }
  return;
}

Assistant:

void CompilerGLSL::set_composite_constant(ConstantID const_id, TypeID type_id,
                                          const SmallVector<ConstantID> &initializers)
{
	if (maybe_get<SPIRConstantOp>(const_id))
	{
		const_composite_insert_ids[const_id] = initializers;
		return;
	}

	auto &constant = set<SPIRConstant>(const_id, type_id);
	fill_composite_constant(constant, type_id, initializers);
	forwarded_temporaries.insert(const_id);
}